

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O1

int slowreturn(void)

{
  DLword *pDVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  FX *frame68k;
  DLword *pDVar6;
  short *psVar7;
  ulong uVar8;
  DLword *pDVar9;
  
  uVar5 = *(int *)(MachineState.pvar + -10) - 0xbU & 0xffff;
  if ((*(int *)(MachineState.pvar + -10) - 0xbU & 1) != 0) {
    printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar5);
  }
  frame68k = (FX *)((ulong)(uVar5 * 2) + (long)Stackspace);
  if ((MachineState.pvar[-10] & 0xfffe) != MachineState.pvar[-2]) {
    if ((MachineState.pvar[-10] & 1) == 0) {
      pDVar9 = MachineState.pvar + -0xc;
      if (((ulong)pDVar9 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar9);
      }
      MachineState.pvar[-1] = (DLword)((uint)((int)pDVar9 - (int)Lisp_world) >> 1);
      MachineState.pvar[-2] = MachineState.pvar[-10];
    }
    MachineState.pvar[-10] = (short)*(undefined4 *)(MachineState.pvar + -2) + 0xb;
    decusecount68k(frame68k);
    uVar5 = *(int *)(MachineState.pvar + -2) - 10U & 0xffff;
    if ((*(int *)(MachineState.pvar + -2) - 10U & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar5);
    }
    frame68k = (FX *)((ulong)(uVar5 * 2) + (long)Stackspace);
  }
  if (frame68k->field_0x2 == '\0') goto LAB_00125f5f;
  MachineState.csp = MachineState.csp + 2;
  uVar8 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar8) {
    printf("Stack offset is out of range: 0x%tx\n",uVar8);
  }
  MachineState.pvar[-5] = (DLword)uVar8;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  frame68k = make_FXcopy(frame68k);
  if (frame68k == (FX *)0x0) {
    return 1;
  }
  pDVar9 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  if (*(short *)((ulong)pDVar9 ^ 2) != -0x6000) {
    error("pre_moveframe: MP9316");
  }
  sVar2 = *(short *)((ulong)pDVar9 ^ 2);
  pDVar1 = pDVar9;
  while (sVar2 == -0x6000) {
    pDVar1 = pDVar1 + *(ushort *)((ulong)(pDVar1 + 1) ^ 2);
    MachineState.endofstack = pDVar1;
    sVar2 = *(short *)((ulong)pDVar1 ^ 2);
  }
  while( true ) {
    MachineState.csp = pDVar9 + -2;
LAB_00125f5f:
    pDVar9 = (DLword *)((ulong)((uint)frame68k->nextblock * 2) + (long)Stackspace);
    uVar3 = MachineState.pvar[-1];
    if ((uVar3 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)(uint)uVar3);
    }
    pDVar1 = Stackspace + (uint)uVar3;
    psVar7 = (short *)((ulong)pDVar9 ^ 2);
    if (*psVar7 == -0x6000) break;
    if (pDVar9 == MachineState.ivar) {
      if ((char)pDVar1[1] == '\0') break;
      MachineState.csp = MachineState.csp + 2;
      uVar8 = (long)MachineState.csp - (long)Stackspace >> 1;
      if (0xffff < uVar8) {
        printf("Stack offset is out of range: 0x%tx\n",uVar8);
      }
      MachineState.pvar[-5] = (DLword)uVar8;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      frame68k = make_FXcopy(frame68k);
      if (frame68k == (FX *)0x0) {
        return 1;
      }
      pDVar9 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
      if (*(short *)((ulong)pDVar9 ^ 2) != -0x6000) {
        error("pre_moveframe: MP9316");
      }
      sVar2 = *(short *)((ulong)pDVar9 ^ 2);
      pDVar1 = pDVar9;
      while (sVar2 == -0x6000) {
        pDVar1 = pDVar1 + *(ushort *)((ulong)(pDVar1 + 1) ^ 2);
        MachineState.endofstack = pDVar1;
        sVar2 = *(short *)((ulong)pDVar1 ^ 2);
      }
    }
    else {
      MachineState.csp = MachineState.csp + 2;
      uVar8 = (long)MachineState.csp - (long)Stackspace >> 1;
      if (0xffff < uVar8) {
        printf("Stack offset is out of range: 0x%tx\n",uVar8);
      }
      MachineState.pvar[-5] = (DLword)uVar8;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      frame68k = make_FXcopy(frame68k);
      if (frame68k == (FX *)0x0) {
        return 1;
      }
      pDVar9 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
      if (*(short *)((ulong)pDVar9 ^ 2) != -0x6000) {
        error("pre_moveframe: MP9316");
      }
      sVar2 = *(short *)((ulong)pDVar9 ^ 2);
      pDVar1 = pDVar9;
      while (sVar2 == -0x6000) {
        pDVar1 = pDVar1 + *(ushort *)((ulong)(pDVar1 + 1) ^ 2);
        MachineState.endofstack = pDVar1;
        sVar2 = *(short *)((ulong)pDVar1 ^ 2);
      }
    }
  }
  pDVar6 = MachineState.ivar;
  if ((*MachineState.pvar & 0x2000000) != 0) {
    pDVar6 = MachineState.pvar + -0xc;
    uVar3 = pDVar1[1];
    if ((char)uVar3 == '\0') {
      *(undefined2 *)((ulong)MachineState.ivar ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.ivar + 1) ^ 2) =
           (short)((uint)((int)pDVar1 - (int)MachineState.ivar) >> 1) + 2;
      if (*(short *)((ulong)(MachineState.ivar + 1) ^ 2) == 0) {
        error("creating 0-len block");
      }
    }
    else {
      pDVar1[1] = uVar3 & 0xff00 | uVar3 - 1 & 0xff;
    }
  }
  *(undefined2 *)((ulong)pDVar6 ^ 2) = 0xa000;
  uVar5 = (int)MachineState.endofstack - (int)pDVar6;
  *(short *)((ulong)(pDVar6 + 1) ^ 2) = (short)(uVar5 >> 1);
  if ((uVar5 & 0x1fffe) == 0) {
    error("creating 0-len block");
  }
  MachineState.pvar = &frame68k[1].alink;
  if (*psVar7 != -0x6000) {
    error("OP_return: MP9316");
  }
  sVar2 = *psVar7;
  pDVar1 = pDVar9;
  while (sVar2 == -0x6000) {
    pDVar1 = pDVar1 + *(ushort *)((ulong)(pDVar1 + 1) ^ 2);
    MachineState.endofstack = pDVar1;
    sVar2 = *(short *)((ulong)pDVar1 ^ 2);
  }
  uVar3 = MachineState.pvar[-9];
  if ((uVar3 >> 10 & 1) == 0) {
    lVar4 = -4;
    if ((uVar3 >> 8 & 1) != 0) {
      MachineState.pvar[-9] = uVar3 & 0xfaff;
      MachineState.tosvalue = *(LispPTR *)(pDVar9 + -2);
      lVar4 = -8;
    }
    MachineState.csp = (DLword *)((long)pDVar9 + lVar4);
    MachineState.ivar =
         (DLword *)
         ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
    uVar5 = *(uint *)(MachineState.pvar + -8);
    if ((uVar5 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
    }
    MachineState.currentfunc =
         (fnhead *)((ulong)uVar5 * 2 + CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
    MachineState.currentpc =
         (ByteCode *)((long)&(MachineState.currentfunc)->na + (ulong)MachineState.pvar[-6]);
  }
  else {
    error("Stack error: INCALL bit found in returnee frame");
    error("Control reached end of slowreturn()!");
  }
  return 0;
}

Assistant:

int slowreturn(void) {
  DLword *next68k;
  DLword *freeptr;
  Bframe *currentBF;
  FX *returnFX;

  S_CHECK(SLOWP(CURRENTFX), "CURRENTFX not SLOWP");

  /* Get returnee's FX from CURRENTFX->alink , It's SLOWP case */
  returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->alink - 11);

  if ((CURRENTFX->alink & 0xFFFE) != CURRENTFX->clink) { /* ALINK != CLINK */
#ifdef STACKCHECK
    printf("A!=C\n");
#endif
    /* return to CLINK fx */
    SETALINK(CURRENTFX, CURRENTFX->clink);
    decusecount68k(returnFX);
    returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->clink - FRAMESIZE);
  }

  if (returnFX->usecount != 0) { /* COPY returnee's FX */
#ifdef STACKCHECK
    printf("returnFX->usecount !=0\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
  }

retry: /* this is retry entry after MAKE_FXCOPY etc */

  next68k = NativeAligned2FromStackOffset(returnFX->nextblock);
  currentBF = (Bframe *)NativeAligned4FromStackOffset(CURRENTFX->blink);

  if (GETWORD(next68k) == STK_FSB_WORD) {
  another:
    freeptr = ((DLword *)CURRENTFX) - 2;
    if (BFRAMEPTR(freeptr)->residual) {
      if (BFRAMEPTR(currentBF)->usecnt == 0) {
        /* make FREEBLOCK for real BF */
        GETWORD(IVar) = STK_FSB_WORD;
        GETWORD(IVar + 1) = (((UNSIGNED)currentBF - (UNSIGNED)IVar) >> 1) + 2;
        if (0 == GETWORD(IVar + 1)) error("creating 0-len block");
      } else
        BFRAMEPTR(currentBF)->usecnt--;
    } else
      freeptr = IVar; /* reset free ptr: not residual case */

    /* free FX + BF(dummy or real) */
    GETWORD(freeptr) = STK_FSB_WORD;
    GETWORD(freeptr + 1) = ((UNSIGNED)EndSTKP - (UNSIGNED)freeptr) >> 1;
    if (0 == GETWORD(freeptr + 1)) error("creating 0-len block");
    S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr!");
    S_CHECK(FSB_size(freeptr) >= MINEXTRASTACKWORDS,
            "free block < min size, after deciding it fits.");

    PVar = ((DLword *)returnFX) + FRAMESIZE;
    /*  Now right CURRENTFX(PVar) is set */

    if (GETWORD(next68k) != STK_FSB_WORD) error("OP_return: MP9316");

    freeptr = next68k;
    while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

    if (CURRENTFX->incall) { /* this frame is  Interrupted */
      error("Stack error: INCALL bit found in returnee frame");
    } else {
      if (CURRENTFX->nopush) {
        CURRENTFX->nopush = NIL;
        CurrentStackPTR = next68k - 2;
        TopOfStack = *((LispPTR *)CurrentStackPTR);
        CurrentStackPTR -= 2;

      } else
        CurrentStackPTR = next68k - 2;

      S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr");

      FastRetCALL;
#ifdef LISPTRACE
      printf("TRACE: return from ");
      print(fnobj->framename);
      printf(" :<= ");
      print(TopOfStack);
      printf("\n");
#endif
      return (0); /* normal return */
    }

  } /* FSB end */
  else if (next68k != IVar) {
#ifdef STACKCHECK
    printf("next68k != IVar and not FSB\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else if (BFRAMEPTR(currentBF)->usecnt != 0) {
#ifdef STACKCHECK
    printf("currentBF->usecnt != 0");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else {
    if ((next68k == IVar) || (BFRAMEPTR(currentBF)->usecnt == 0))
      goto another;
    else
      error("Shouldn't");
  }
  error("Control reached end of slowreturn()!");
  return (NIL); /* NOT REACHED */
}